

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O1

int Bac_ObjName(Bac_Ntk_t *p,int i)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  
  if ((-1 < i) && (iVar1 = (p->vType).nSize, i < iVar1)) {
    pcVar3 = (p->vType).pArray;
    uVar4 = (ulong)(uint)i;
    if ((pcVar3[uVar4] & 0xfcU) == 4) {
      if (i < (p->vFanin).nSize) {
        iVar2 = (p->vFanin).pArray[uVar4];
        uVar4 = (ulong)iVar2;
        if (((long)uVar4 < 0) || (iVar1 <= iVar2)) goto LAB_0033a3d9;
        if ((pcVar3[uVar4] & 0xfcU) == 4) {
          __assert_fail("!Bac_ObjIsCo(p, i)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/bac/bac.h"
                        ,0x11f,"int Bac_ObjNameInt(Bac_Ntk_t *, int)");
        }
        if (iVar2 < (p->vName).nSize) goto LAB_0033a3cd;
      }
    }
    else if (i < (p->vName).nSize) {
LAB_0033a3cd:
      return (p->vName).pArray[uVar4];
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
LAB_0033a3d9:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecStr.h"
                ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
}

Assistant:

static inline int            Bac_ObjName( Bac_Ntk_t * p, int i )             { return Bac_ObjIsCo(p, i) ? Bac_ObjNameInt(p, Bac_ObjFanin(p,i)) : Bac_ObjNameInt(p, i);     }